

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O1

Tensor * __thiscall cnn::ComputationGraph::get_value(ComputationGraph *this,Expression *e)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->ee->_vptr_ExecutionEngine[7])();
  return (Tensor *)CONCAT44(extraout_var,iVar1);
}

Assistant:

const Tensor& ComputationGraph::get_value(const expr::Expression& e) { return this->get_value(e.i); }